

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coeffarraydemo.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  FILE *pFVar6;
  FILE *__stream;
  double *pdVar7;
  int i;
  int iVar8;
  double a;
  Fir1 fir;
  double local_58;
  double *local_50;
  double *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  pdVar5 = (double *)operator_new__(400);
  local_50 = pdVar5;
  local_48 = (double *)operator_new__(400);
  local_40 = 0x32;
  local_38 = 0;
  memset(local_48,0,400);
  memcpy(pdVar5,lp,400);
  printf("taps = %d\n",0x32);
  pFVar6 = fopen("ecg50hz.dat","rt");
  __stream = fopen("ecg_filtered.dat","wt");
  iVar8 = 0;
  do {
    iVar4 = __isoc99_fscanf(pFVar6,"%lf\n",&local_58);
    if (iVar4 < 1) break;
    pdVar5 = local_48 + local_40._4_4_;
    *pdVar5 = local_58;
    local_58 = 0.0;
    pdVar7 = local_50;
    do {
      dVar1 = *pdVar5;
      dVar2 = *pdVar7;
      pdVar5 = pdVar5 + -1;
      pdVar7 = pdVar7 + 1;
      local_58 = local_58 + dVar1 * dVar2;
    } while (local_48 <= pdVar5);
    if (pdVar7 < local_50 + (local_40 & 0xffffffff)) {
      pdVar5 = local_48 + (local_40 & 0xffffffff);
      do {
        pdVar5 = pdVar5 + -1;
        dVar1 = *pdVar7;
        pdVar7 = pdVar7 + 1;
        local_58 = local_58 + *pdVar5 * dVar1;
      } while (pdVar7 < local_50 + (local_40 & 0xffffffff));
    }
    uVar3 = local_40._4_4_ + 1;
    if ((uint)local_40 <= local_40._4_4_ + 1) {
      uVar3 = 0;
    }
    local_40 = CONCAT44(uVar3,(uint)local_40);
    fprintf(__stream,"%f\n");
    iVar8 = iVar8 + 1;
  } while (iVar8 != 10000);
  main_cold_1();
  return 0;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(lp);

	// gets the number of taps
	int taps = fir.getTaps();

	printf("taps = %d\n",taps);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;i<10000;i++) 
	{
		double a;
		if (fscanf(finput,"%lf\n",&a)<1) break;
		a = fir.filter(a);
		fprintf(foutput,"%f\n",a);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}